

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_667a22::GetIndexArg(string *arg,int *idx,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id;
  cmAlphaNum local_180;
  string local_150;
  cmAlphaNum local_130;
  undefined1 local_100 [8];
  string msg;
  string local_a0;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string warn;
  long value;
  cmMakefile *mf_local;
  int *idx_local;
  string *arg_local;
  
  bVar1 = cmStrToLong(arg,(long *)(warn.field_2._M_local_buf + 8));
  if (!bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0121,false);
    switch(PVar2) {
    case WARN:
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_a0,(cmPolicies *)0x79,id);
      cmAlphaNum::cmAlphaNum(&local_80,&local_a0);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&msg.field_2 + 8)," Invalid list index \"");
      cmStrCat<std::__cxx11::string,char[3]>
                ((string *)local_50,&local_80,(cmAlphaNum *)((long)&msg.field_2 + 8),arg,
                 (char (*) [3])0xded001);
      std::__cxx11::string::~string((string *)&local_a0);
      cmMakefile::IssueMessage(mf,AUTHOR_WARNING,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
    case OLD:
      break;
    case NEW:
      return false;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_150,(cmPolicies *)0x79,id);
      cmAlphaNum::cmAlphaNum(&local_130,&local_150);
      cmAlphaNum::cmAlphaNum(&local_180," Invalid list index \"");
      cmStrCat<std::__cxx11::string,char[3]>
                ((string *)local_100,&local_130,&local_180,arg,(char (*) [3])0xded001);
      std::__cxx11::string::~string((string *)&local_150);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_100);
      std::__cxx11::string::~string((string *)local_100);
    }
  }
  *idx = warn.field_2._8_4_;
  return true;
}

Assistant:

bool GetIndexArg(const std::string& arg, int* idx, cmMakefile& mf)
{
  long value;
  if (!cmStrToLong(arg, &value)) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0121)) {
      case cmPolicies::WARN: {
        // Default is to warn and use old behavior OLD behavior is to allow
        // compatibility, so issue a warning and use the previous behavior.
        std::string warn =
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::AUTHOR_WARNING, warn);
        CM_FALLTHROUGH;
      }
      case cmPolicies::OLD:
        // OLD behavior is to allow compatibility, so just ignore the
        // situation.
        break;
      case cmPolicies::NEW:
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        std::string msg =
          cmStrCat(cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::FATAL_ERROR, msg);
        break;
    }
  }

  // Truncation is happening here, but it had always been happening here.
  *idx = static_cast<int>(value);

  return true;
}